

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O2

MPP_RET mpp_av1_read_unit(AV1Context *ctx,Av1ObuUnit *unit)

{
  RK_U8 RVar1;
  int iVar2;
  RK_U32 RVar3;
  RK_U64 RVar4;
  RK_U8 RVar5;
  byte bVar6;
  RK_U8 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  MPP_RET MVar10;
  uint uVar11;
  AV1RawOBUHeader *current;
  AV1RawOBUHeader AVar12;
  MppFrameHdrDynamicMeta *pMVar13;
  FILE *__s;
  ulong uVar14;
  char *fname;
  AV1RawTileData *td;
  long lVar15;
  AV1RawSequenceHeader *pAVar16;
  RK_U8 *pRVar17;
  BitReadCtx_t *bitctx;
  int iVar18;
  char *in_R8;
  int iVar19;
  RK_S32 i;
  uint uVar20;
  AV1RawOBUHeader AVar21;
  AV1RawOBUHeader AVar22;
  ulong uVar23;
  size_t size;
  bool bVar24;
  AV1RawOBUHeader in_stack_fffffffffffffe88;
  undefined4 uVar25;
  BitReadCtx_t gbc;
  RK_U64 obu_size;
  AV1Context *local_80;
  RK_S32 local_74;
  Av1ObuUnit *local_70;
  AV1RawSequenceHeader *local_68;
  MppWriteCtx bit_ctx;
  
  if (unit->content != (void *)0x0) {
    mpp_osal_free("mpp_av1_alloc_unit_content",unit->content);
  }
  unit->content = (void *)0x0;
  current = (AV1RawOBUHeader *)mpp_osal_calloc("mpp_av1_alloc_unit_content",0xb20);
  unit->content = current;
  if (current == (AV1RawOBUHeader *)0x0) {
    return MPP_ERR_NOMEM;
  }
  mpp_set_bitread_ctx(&gbc,unit->data,(RK_S32)unit->data_size);
  RVar8 = mpp_get_bits_count(&gbc);
  RVar9 = mpp_av1_read_obu_header(ctx,&gbc,current);
  if (RVar9 < 0) {
    return MPP_NOK;
  }
  if (unit->type != (uint)current->obu_type) {
    in_stack_fffffffffffffe88.obu_forbidden_bit = '\x19';
    in_stack_fffffffffffffe88.obu_type = '\v';
    in_stack_fffffffffffffe88.obu_extension_flag = '\0';
    in_stack_fffffffffffffe88.obu_has_size_field = '\0';
    in_R8 = "obu->header.obu_type == unit->type";
    _mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
               "obu->header.obu_type == unit->type","mpp_av1_read_unit",in_stack_fffffffffffffe88);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001b8d11;
  }
  if (current->obu_has_size_field == '\0') {
    if (unit->data_size <= (ulong)current->obu_extension_flag) {
      _mpp_log_l(2,"av1d_cbs","Invalid OBU length: unit too short (%d).\n",(char *)0x0);
      return MPP_NOK;
    }
    in_R8 = (char *)(unit->data_size + ~(ulong)current->obu_extension_flag);
    current[1] = (AV1RawOBUHeader)in_R8;
  }
  else {
    obu_size = 0;
    MVar10 = mpp_av1_read_leb128(&gbc,&obu_size);
    if (MVar10 < MPP_OK) {
      return MVar10;
    }
    current[1].obu_forbidden_bit = (byte)obu_size;
    current[1].obu_type = obu_size._1_1_;
    current[1].obu_extension_flag = obu_size._2_1_;
    current[1].obu_has_size_field = obu_size._3_1_;
    current[1].obu_reserved_1bit = obu_size._4_1_;
    current[1].temporal_id = obu_size._5_1_;
    current[1].spatial_id = obu_size._6_1_;
    current[1].extension_header_reserved_3bits = obu_size._7_1_;
  }
  local_70 = unit;
  local_74 = mpp_get_bits_count(&gbc);
  if (ctx->fist_tile_group == 0) {
    ctx->frame_tag_size = ctx->frame_tag_size + ((local_74 - RVar8) + 7 >> 3);
  }
  bVar6 = current->obu_type;
  if (((1 < (byte)(bVar6 - 1) && current->obu_extension_flag != '\0') &&
      (ctx->operating_point_idc != 0)) &&
     (((1 << ((char)ctx->spatial_id + 8U & 0x1f) | 1 << ((byte)ctx->temporal_id & 0x1f)) &
      ~ctx->operating_point_idc) != 0)) {
    return MPP_ERR_PROTOL;
  }
  if ((av1d_debug & 2) != 0) {
    in_R8._1_1_ = '\0';
    in_R8._2_1_ = '\0';
    in_R8._3_1_ = '\0';
    in_R8._4_1_ = '\0';
    in_R8._5_1_ = '\0';
    in_R8._6_1_ = '\0';
    in_R8._7_1_ = '\0';
    in_R8._0_1_ = bVar6;
    _mpp_log_l(4,"av1d_cbs","obu type %d size %d\n","mpp_av1_read_unit",in_R8,current[1]);
    bVar6 = current->obu_type;
  }
  uVar25 = in_stack_fffffffffffffe88._4_4_;
  MVar10 = MPP_ERR_VALUE;
  switch(bVar6) {
  case 1:
    MVar10 = mpp_av1_read_unsigned(&gbc,3,"seq_profile",(RK_U32 *)&obu_size,0,2);
    if (MVar10 < MPP_OK) {
      return MVar10;
    }
    pAVar16 = (AV1RawSequenceHeader *)(current + 2);
    pAVar16->seq_profile = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"still_picture",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[2].obu_type = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"reduced_still_picture_header",(RK_U32 *)&obu_size,0,1);
    uVar25 = in_stack_fffffffffffffe88._4_4_;
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[2].obu_extension_flag = (byte)obu_size;
    if ((byte)obu_size == '\0') {
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"timing_info_present_flag",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[2].obu_has_size_field = (byte)obu_size;
      if ((byte)obu_size == '\0') {
        current[2].obu_reserved_1bit = '\0';
      }
      else {
        MVar10 = mpp_av1_read_unsigned
                           (&gbc,0x20,"num_units_in_display_tick",(RK_U32 *)&obu_size,1,0xffffffff);
        RVar4 = obu_size;
        if (MVar10 < MPP_OK) {
          return MVar10;
        }
        current[3].obu_forbidden_bit = (byte)obu_size;
        current[3].obu_type = obu_size._1_1_;
        current[3].obu_extension_flag = obu_size._2_1_;
        current[3].obu_has_size_field = obu_size._3_1_;
        obu_size = RVar4;
        RVar8 = mpp_av1_read_unsigned(&gbc,0x20,"time_scale",(RK_U32 *)&obu_size,1,0xffffffff);
        RVar4 = obu_size;
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].obu_reserved_1bit = (byte)obu_size;
        current[3].temporal_id = obu_size._1_1_;
        current[3].spatial_id = obu_size._2_1_;
        current[3].extension_header_reserved_3bits = obu_size._3_1_;
        obu_size = RVar4;
        RVar8 = mpp_av1_read_unsigned(&gbc,1,"equal_picture_interval",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[4].obu_forbidden_bit = (byte)obu_size;
        bVar24 = (byte)obu_size != '\0';
        if (bVar24) {
          mpp_read_ue(&gbc,(RK_U32 *)&obu_size);
          RVar4 = obu_size;
          if ((RK_U32)obu_size == -1) {
            _mpp_log_l(2,"av1d_cbs","%s out of range: %d, but must be in [%d,%d].\n",
                       "mpp_av1_read_uvlc","num_ticks_per_picture_minus_1",0xffffffff,
                       (ulong)in_stack_fffffffffffffe88 & 0xffffffff00000000,0xfffffffe);
            return MPP_NOK;
          }
          current[4].obu_reserved_1bit = (byte)obu_size;
          current[4].temporal_id = obu_size._1_1_;
          current[4].spatial_id = obu_size._2_1_;
          current[4].extension_header_reserved_3bits = obu_size._3_1_;
          obu_size = RVar4;
        }
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,1,"decoder_model_info_present_flag",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[2].obu_reserved_1bit = (byte)obu_size;
        if ((byte)obu_size != '\0') {
          MVar10 = mpp_av1_read_unsigned
                             (&gbc,5,"buffer_delay_length_minus_1",(RK_U32 *)&obu_size,0,0x1f);
          if (MVar10 < MPP_OK) {
            return MVar10;
          }
          current[5].obu_forbidden_bit = (byte)obu_size;
          RVar8 = mpp_av1_read_unsigned
                            (&gbc,0x20,"num_units_in_decoding_tick",(RK_U32 *)&obu_size,0,0xffffffff
                            );
          RVar4 = obu_size;
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[5].obu_reserved_1bit = (byte)obu_size;
          current[5].temporal_id = obu_size._1_1_;
          current[5].spatial_id = obu_size._2_1_;
          current[5].extension_header_reserved_3bits = obu_size._3_1_;
          obu_size = RVar4;
          RVar8 = mpp_av1_read_unsigned
                            (&gbc,5,"buffer_removal_time_length_minus_1",(RK_U32 *)&obu_size,0,0x1f)
          ;
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[6].obu_forbidden_bit = (byte)obu_size;
          RVar8 = mpp_av1_read_unsigned
                            (&gbc,5,"frame_presentation_time_length_minus_1",(RK_U32 *)&obu_size,0,
                             0x1f);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[6].obu_type = (byte)obu_size;
        }
      }
      RVar8 = mpp_av1_read_unsigned
                        (&gbc,1,"initial_display_delay_present_flag",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      local_80 = (AV1Context *)CONCAT44(local_80._4_4_,3);
      current[2].temporal_id = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned
                        (&gbc,5,"operating_points_cnt_minus_1",(RK_U32 *)&obu_size,0,0x1f);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[2].spatial_id = (byte)obu_size;
      uVar14 = 0;
      bVar6 = (byte)obu_size;
      local_68 = pAVar16;
      while( true ) {
        uVar25 = in_stack_fffffffffffffe88._4_4_;
        if (bVar6 < uVar14) break;
        RVar8 = mpp_av1_read_unsigned(&gbc,0xc,"operating_point_idc[i]",(RK_U32 *)&obu_size,0,0xfff)
        ;
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        *(RK_U16 *)(&current[6].obu_reserved_1bit + uVar14 * 2) = (RK_U16)obu_size;
        RVar8 = mpp_av1_read_unsigned(&gbc,5,"seq_level_idx[i]",(RK_U32 *)&obu_size,0,0x1f);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        (&current[0xe].obu_reserved_1bit)[uVar14] = (byte)obu_size;
        if ((byte)obu_size < 8) {
          (&current[0x12].obu_reserved_1bit)[uVar14] = '\0';
        }
        else {
          RVar8 = mpp_av1_read_unsigned(&gbc,1,"seq_tier[i]",(RK_U32 *)&obu_size,0,1);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          (&current[0x12].obu_reserved_1bit)[uVar14] = (byte)obu_size;
        }
        if (current[2].obu_reserved_1bit == '\0') {
          (&current[0x16].obu_reserved_1bit)[uVar14] = '\0';
        }
        else {
          RVar8 = mpp_av1_read_unsigned
                            (&gbc,1,"decoder_model_present_for_this_op[i]",(RK_U32 *)&obu_size,0,1);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          (&current[0x16].obu_reserved_1bit)[uVar14] = (byte)obu_size;
          if ((byte)obu_size != '\0') {
            iVar19 = current[5].obu_forbidden_bit + 1;
            uVar11 = ~(uint)(-1L << ((byte)iVar19 & 0x3f));
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,iVar19,"decoder_buffer_delay[i]",(RK_U32 *)&obu_size,0,uVar11);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            *(RK_U32 *)(&current[0x1a].obu_reserved_1bit + uVar14 * 4) = (RK_U32)obu_size;
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,iVar19,"encoder_buffer_delay[i]",(RK_U32 *)&obu_size,0,uVar11);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            *(RK_U32 *)(&current[0x2a].obu_reserved_1bit + uVar14 * 4) = (RK_U32)obu_size;
            RVar8 = mpp_av1_read_unsigned(&gbc,1,"low_delay_mode_flag[i]",(RK_U32 *)&obu_size,0,1);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[0x3a].obu_reserved_1bit)[uVar14] = (byte)obu_size;
            pAVar16 = local_68;
          }
        }
        if (current[2].temporal_id != '\0') {
          RVar8 = mpp_av1_read_unsigned
                            (&gbc,1,"initial_display_delay_present_for_this_op[i]",
                             (RK_U32 *)&obu_size,0,1);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          (&current[0x3e].obu_reserved_1bit)[uVar14] = (byte)obu_size;
          if ((byte)obu_size != '\0') {
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,4,"initial_display_delay_minus_1[i]",(RK_U32 *)&obu_size,0,0xf);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[0x42].obu_reserved_1bit)[uVar14] = (byte)obu_size;
          }
        }
        uVar14 = uVar14 + 1;
        bVar6 = current[2].spatial_id;
      }
    }
    else {
      current[6].obu_reserved_1bit = '\0';
      current[6].temporal_id = '\0';
      current[2].obu_has_size_field = '\0';
      current[2].obu_reserved_1bit = '\0';
      current[2].temporal_id = '\0';
      current[2].spatial_id = '\0';
      RVar8 = mpp_av1_read_unsigned(&gbc,5,"seq_level_idx[0]",(RK_U32 *)&obu_size,0,0x1f);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      local_80 = (AV1Context *)CONCAT44(local_80._4_4_,3);
      current[0xe].obu_reserved_1bit = (byte)obu_size;
      current[0x12].obu_reserved_1bit = '\0';
      current[0x16].obu_reserved_1bit = '\0';
      current[0x3e].obu_reserved_1bit = '\0';
    }
    RVar8 = mpp_av1_read_unsigned(&gbc,4,"frame_width_bits_minus_1",(RK_U32 *)&obu_size,0,0xf);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x46].obu_reserved_1bit = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned(&gbc,4,"frame_height_bits_minus_1",(RK_U32 *)&obu_size,0,0xf);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x46].temporal_id = (byte)obu_size;
    iVar19 = current[0x46].obu_reserved_1bit + 1;
    RVar8 = mpp_av1_read_unsigned
                      (&gbc,iVar19,"max_frame_width_minus_1",(RK_U32 *)&obu_size,0,
                       ~(uint)(-1L << ((byte)iVar19 & 0x3f)));
    RVar4 = obu_size;
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x46].spatial_id = (byte)obu_size;
    current[0x46].extension_header_reserved_3bits = obu_size._1_1_;
    iVar19 = current[0x46].temporal_id + 1;
    obu_size = RVar4;
    RVar8 = mpp_av1_read_unsigned
                      (&gbc,iVar19,"max_frame_height_minus_1",(RK_U32 *)&obu_size,0,
                       ~(uint)(-1L << ((byte)iVar19 & 0x3f)));
    RVar4 = obu_size;
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x47].obu_forbidden_bit = (byte)obu_size;
    current[0x47].obu_type = obu_size._1_1_;
    obu_size = RVar4;
    if (current[2].obu_extension_flag == '\0') {
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"frame_id_numbers_present_flag",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x47].obu_extension_flag = (byte)obu_size;
      if ((byte)obu_size != '\0') {
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,4,"delta_frame_id_length_minus_2",(RK_U32 *)&obu_size,0,0xf);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x47].obu_has_size_field = (byte)obu_size;
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,3,"additional_frame_id_length_minus_1",(RK_U32 *)&obu_size,0,7);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x47].obu_reserved_1bit = (byte)obu_size;
      }
    }
    else {
      current[0x47].obu_extension_flag = '\0';
    }
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"use_128x128_superblock",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x47].temporal_id = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_filter_intra",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x47].spatial_id = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_intra_edge_filter",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x47].extension_header_reserved_3bits = (byte)obu_size;
    if (current[2].obu_extension_flag == '\0') {
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_interintra_compound",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x48].obu_forbidden_bit = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_masked_compound",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x48].obu_type = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_warped_motion",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x48].obu_extension_flag = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_dual_filter",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x48].obu_has_size_field = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_order_hint",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x48].obu_reserved_1bit = (byte)obu_size;
      if ((byte)obu_size == '\0') {
        current[0x48].temporal_id = '\0';
        current[0x48].spatial_id = '\0';
      }
      else {
        RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_jnt_comp",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x48].temporal_id = (byte)obu_size;
        RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_ref_frame_mvs",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x48].spatial_id = (byte)obu_size;
      }
      RVar8 = mpp_av1_read_unsigned
                        (&gbc,1,"seq_choose_screen_content_tools",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x48].extension_header_reserved_3bits = (byte)obu_size;
      if ((byte)obu_size == '\0') {
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,1,"seq_force_screen_content_tools",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x49].obu_forbidden_bit = (byte)obu_size;
        if ((byte)obu_size != '\0') goto LAB_001b8b30;
LAB_001b8cc0:
        current[0x49].obu_extension_flag = '\x02';
      }
      else {
        current[0x49].obu_forbidden_bit = '\x02';
LAB_001b8b30:
        RVar8 = mpp_av1_read_unsigned(&gbc,1,"seq_choose_integer_mv",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x49].obu_type = (byte)obu_size;
        if ((byte)obu_size != '\0') goto LAB_001b8cc0;
        RVar8 = mpp_av1_read_unsigned(&gbc,1,"seq_force_integer_mv",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x49].obu_extension_flag = (byte)obu_size;
      }
      if (current[0x48].obu_reserved_1bit != '\0') {
        RVar8 = mpp_av1_read_unsigned(&gbc,3,"order_hint_bits_minus_1",(RK_U32 *)&obu_size,0,7);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x49].obu_has_size_field = (byte)obu_size;
      }
    }
    else {
      current[0x48].obu_has_size_field = '\0';
      current[0x48].obu_reserved_1bit = '\0';
      current[0x48].temporal_id = '\0';
      current[0x48].spatial_id = '\0';
      current[0x48].obu_forbidden_bit = '\0';
      current[0x48].obu_type = '\0';
      current[0x48].obu_extension_flag = '\0';
      current[0x48].obu_has_size_field = '\0';
      current[0x49].obu_forbidden_bit = '\x02';
      current[0x49].obu_extension_flag = '\x02';
    }
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_superres",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x49].obu_reserved_1bit = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_cdef",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x49].temporal_id = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"enable_restoration",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x49].spatial_id = (byte)obu_size;
    RVar1 = current[2].obu_forbidden_bit;
    MVar10 = mpp_av1_read_unsigned(&gbc,1,"high_bitdepth",(RK_U32 *)&obu_size,0,1);
    if (MVar10 < MPP_OK) {
      return MVar10;
    }
    RVar5 = (RK_U8)obu_size;
    current[0x49].extension_header_reserved_3bits = RVar5;
    if (RVar5 == '\0' || RVar1 != '\x02') {
      ctx->bit_depth = (uint)(RVar5 != '\0') * 2 + 8;
      if (RVar1 != '\x01') goto LAB_001b8926;
      current[0x4a].obu_type = '\0';
      bVar24 = true;
    }
    else {
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"twelve_bit",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x4a].obu_forbidden_bit = (byte)obu_size;
      ctx->bit_depth = (uint)((byte)obu_size != '\0') * 2 + 10;
LAB_001b8926:
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"mono_chrome",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x4a].obu_type = (byte)obu_size;
      local_80 = (AV1Context *)CONCAT44(local_80._4_4_,(uint)((byte)obu_size == '\0') * 2 + 1);
      bVar24 = false;
    }
    ctx->num_planes = (RK_S32)local_80;
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"color_description_present_flag",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x4a].obu_extension_flag = (byte)obu_size;
    if ((byte)obu_size == '\0') {
      current[0x4a].obu_has_size_field = '\x02';
      current[0x4a].obu_reserved_1bit = '\x02';
      current[0x4a].temporal_id = '\x02';
      RVar7 = '\x02';
      RVar5 = '\x02';
    }
    else {
      RVar8 = mpp_av1_read_unsigned(&gbc,8,"color_primaries",(RK_U32 *)&obu_size,0,0xff);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x4a].obu_has_size_field = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,8,"transfer_characteristics",(RK_U32 *)&obu_size,0,0xff);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x4a].obu_reserved_1bit = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,8,"matrix_coefficients",(RK_U32 *)&obu_size,0,0xff);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x4a].temporal_id = (byte)obu_size;
      RVar5 = current[0x4a].obu_reserved_1bit;
      RVar7 = (byte)obu_size;
      if ((RVar5 == '\x10') || (RVar5 == '\x0e')) {
        ctx->is_hdr = 1;
      }
    }
    if (current[0x4a].obu_type == '\0') {
      if ((RVar5 == '\r' && current[0x4a].obu_has_size_field == '\x01') && RVar7 == '\0') {
        current[0x4a].spatial_id = '\x01';
        current[0x4a].extension_header_reserved_3bits = '\0';
LAB_001b8bc6:
        current[0x4b].obu_forbidden_bit = '\0';
      }
      else {
        RVar8 = mpp_av1_read_unsigned(&gbc,1,"color_range",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[0x4a].spatial_id = (byte)obu_size;
        if (RVar1 == '\0') {
          *(undefined2 *)&current[0x4a].extension_header_reserved_3bits = 0x101;
LAB_001b8d85:
          RVar8 = mpp_av1_read_unsigned(&gbc,2,"chroma_sample_position",(RK_U32 *)&obu_size,0,2);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[0x4b].obu_type = (byte)obu_size;
        }
        else if (bVar24) {
          *(undefined2 *)&current[0x4a].extension_header_reserved_3bits = 0;
        }
        else if (ctx->bit_depth == 0xc) {
          RVar8 = mpp_av1_read_unsigned(&gbc,1,"subsampling_x",(RK_U32 *)&obu_size,0,1);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[0x4a].extension_header_reserved_3bits = (byte)obu_size;
          if ((byte)obu_size == '\0') goto LAB_001b8bc6;
          RVar8 = mpp_av1_read_unsigned(&gbc,1,"subsampling_y",(RK_U32 *)&obu_size,0,1);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[0x4b].obu_forbidden_bit = (RK_U8)obu_size;
          if ((RK_U8)obu_size != '\0' && current[0x4a].extension_header_reserved_3bits != '\0')
          goto LAB_001b8d85;
        }
        else {
          *(undefined2 *)&current[0x4a].extension_header_reserved_3bits = 1;
        }
      }
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"separate_uv_delta_q",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x4b].obu_extension_flag = (byte)obu_size;
    }
    else {
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"color_range",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[0x4a].spatial_id = (byte)obu_size;
      *(undefined4 *)&current[0x4a].extension_header_reserved_3bits = 0x101;
    }
    RVar8 = mpp_av1_read_unsigned(&gbc,1,"film_grain_params_present",(RK_U32 *)&obu_size,0,1);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[0x4b].obu_has_size_field = (byte)obu_size;
    ctx->frame_tag_size = ctx->frame_tag_size + *(int *)(current + 1);
    uVar11 = ctx->operating_point;
    if (-1 < (long)(int)uVar11) {
      if (current[2].spatial_id < uVar11) {
        _mpp_log_l(2,"av1d_cbs",
                   "Invalid Operating Point %d requested. Must not be higher than %u.\n",(char *)0x0
                  );
        return MPP_ERR_PROTOL;
      }
      ctx->operating_point_idc =
           (uint)*(ushort *)(&current[6].obu_reserved_1bit + (long)(int)uVar11 * 2);
    }
    ctx->sequence_header = pAVar16;
    break;
  case 2:
    ctx->seen_frame_header = 0;
    break;
  case 3:
  case 7:
    MVar10 = mpp_av1_frame_header_obu
                       (ctx,&gbc,(AV1RawFrameHeader *)(current + 2),(uint)(bVar6 == 7),in_R8);
    if (MVar10 < MPP_OK) {
      return MVar10;
    }
    ctx->frame_tag_size = ctx->frame_tag_size + *(int *)(current + 1);
    break;
  case 4:
    RVar8 = mpp_get_bits_count(&gbc);
    MVar10 = mpp_av1_tile_group_obu(ctx,&gbc,(AV1RawTileGroup *)(current + 2));
    if (MVar10 < MPP_OK) {
      return MVar10;
    }
    if (ctx->fist_tile_group == 0) {
      RVar9 = mpp_get_bits_count(&gbc);
      ctx->frame_tag_size = ctx->frame_tag_size + ((RVar9 - RVar8) + 7U >> 3);
    }
    ctx->fist_tile_group = 1;
    goto LAB_001b7182;
  case 5:
    ctx->frame_tag_size = ctx->frame_tag_size + *(int *)(current + 1);
    MVar10 = mpp_av1_read_leb128(&gbc,&obu_size);
    if (MVar10 < MPP_OK) {
      return MVar10;
    }
    current[2].obu_forbidden_bit = (byte)obu_size;
    current[2].obu_type = obu_size._1_1_;
    current[2].obu_extension_flag = obu_size._2_1_;
    current[2].obu_has_size_field = obu_size._3_1_;
    current[2].obu_reserved_1bit = obu_size._4_1_;
    current[2].temporal_id = obu_size._5_1_;
    current[2].spatial_id = obu_size._6_1_;
    current[2].extension_header_reserved_3bits = obu_size._7_1_;
    AVar12 = (AV1RawOBUHeader)obu_size;
    if ((av1d_debug & 8) != 0) {
      _mpp_log_l(4,"av1d_cbs","%s meta type %lld\n","mpp_av1_metadata_obu");
      AVar12 = current[2];
    }
    uVar25 = in_stack_fffffffffffffe88._4_4_;
    switch(AVar12) {
    case (AV1RawOBUHeader)0x1:
      MVar10 = mpp_av1_read_unsigned(&gbc,0x10,"max_cll",(RK_U32 *)&obu_size,0,0xffff);
      RVar4 = obu_size;
      if (MVar10 < MPP_OK) {
        return MVar10;
      }
      current[3].obu_forbidden_bit = (byte)obu_size;
      current[3].obu_type = obu_size._1_1_;
      obu_size = RVar4;
      RVar8 = mpp_av1_read_unsigned(&gbc,0x10,"max_fall",(RK_U32 *)&obu_size,0,0xffff);
      RVar4 = obu_size;
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[3].obu_extension_flag = (byte)obu_size;
      current[3].obu_has_size_field = obu_size._1_1_;
      (ctx->content_light).MaxCLL = *(RK_U16 *)(current + 3);
      (ctx->content_light).MaxFALL = (RK_U16)obu_size;
      obu_size = RVar4;
      break;
    case (AV1RawOBUHeader)0x2:
      local_80 = ctx;
      for (lVar15 = -3; uVar25 = in_stack_fffffffffffffe88._4_4_, lVar15 != 0; lVar15 = lVar15 + 1)
      {
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,0x10,"primary_chromaticity_x[i]",(RK_U32 *)&obu_size,0,0xffff);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        *(RK_U16 *)(&current[3].spatial_id + lVar15 * 2) = (RK_U16)obu_size;
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,0x10,"primary_chromaticity_y[i]",(RK_U32 *)&obu_size,0,0xffff);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        *(RK_U16 *)(&current[4].obu_reserved_1bit + lVar15 * 2) = (RK_U16)obu_size;
      }
      RVar8 = mpp_av1_read_unsigned
                        (&gbc,0x10,"white_point_chromaticity_x",(RK_U32 *)&obu_size,0,0xffff);
      RVar4 = obu_size;
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[4].obu_reserved_1bit = (byte)obu_size;
      current[4].temporal_id = obu_size._1_1_;
      obu_size = RVar4;
      RVar8 = mpp_av1_read_unsigned
                        (&gbc,0x10,"white_point_chromaticity_y",(RK_U32 *)&obu_size,0,0xffff);
      RVar4 = obu_size;
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[4].spatial_id = (byte)obu_size;
      current[4].extension_header_reserved_3bits = obu_size._1_1_;
      obu_size = RVar4;
      RVar8 = mpp_av1_read_unsigned(&gbc,0x20,"luminance_max",(RK_U32 *)&obu_size,1,0xffffffff);
      RVar4 = obu_size;
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      uVar14 = obu_size & 0xffffffff;
      current[5].obu_forbidden_bit = (byte)obu_size;
      current[5].obu_type = obu_size._1_1_;
      current[5].obu_extension_flag = obu_size._2_1_;
      current[5].obu_has_size_field = obu_size._3_1_;
      uVar14 = uVar14 * 0x40 - 1;
      if (0xfffffffe < uVar14) {
        uVar14 = 0xffffffff;
      }
      obu_size = RVar4;
      RVar8 = mpp_av1_read_unsigned(&gbc,0x20,"luminance_min",(RK_U32 *)&obu_size,0,(RK_U32)uVar14);
      RVar4 = obu_size;
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[5].obu_reserved_1bit = (byte)obu_size;
      current[5].temporal_id = obu_size._1_1_;
      current[5].spatial_id = obu_size._2_1_;
      current[5].extension_header_reserved_3bits = obu_size._3_1_;
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        (local_80->mastering_display).display_primaries[lVar15][0] =
             *(RK_U16 *)(&current[3].obu_forbidden_bit + lVar15 * 2);
        (local_80->mastering_display).display_primaries[lVar15][1] =
             *(RK_U16 *)(&current[3].spatial_id + lVar15 * 2);
      }
      (local_80->mastering_display).white_point[0] = *(RK_U16 *)&current[4].obu_reserved_1bit;
      (local_80->mastering_display).white_point[1] = *(RK_U16 *)&current[4].spatial_id;
      (local_80->mastering_display).max_luminance = *(RK_U32 *)(current + 5);
      (local_80->mastering_display).min_luminance = (RK_U32)obu_size;
      obu_size = RVar4;
      break;
    case (AV1RawOBUHeader)0x3:
      MVar10 = mpp_av1_read_unsigned(&gbc,8,"scalability_mode_idc",(RK_U32 *)&obu_size,0,0xff);
      uVar25 = in_stack_fffffffffffffe88._4_4_;
      if (MVar10 < MPP_OK) {
        return MVar10;
      }
      current[3].obu_forbidden_bit = (byte)obu_size;
      bVar24 = (byte)obu_size == '\x0e';
      if (bVar24) {
        pAVar16 = ctx->sequence_header;
        if (pAVar16 == (AV1RawSequenceHeader *)0x0) {
          _mpp_log_l(2,"av1d_cbs",
                     "No sequence header available: unable to parse scalability metadata.\n",
                     "mpp_av1_scalability_structure");
          return MPP_ERR_UNKNOW;
        }
        MVar10 = mpp_av1_read_unsigned(&gbc,2,"spatial_layers_cnt_minus_1",(RK_U32 *)&obu_size,0,3);
        if (MVar10 < MPP_OK) {
          return MVar10;
        }
        current[3].obu_type = (byte)obu_size;
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,1,"spatial_layer_dimensions_present_flag",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].obu_extension_flag = (byte)obu_size;
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,1,"spatial_layer_description_present_flag",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].obu_has_size_field = (byte)obu_size;
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,1,"temporal_group_description_present_flag",(RK_U32 *)&obu_size,0,1)
        ;
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].obu_reserved_1bit = (byte)obu_size;
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,3,"scalability_structure_reserved_3bits",(RK_U32 *)&obu_size,0,0);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].temporal_id = (byte)obu_size;
        if (current[3].obu_extension_flag != '\0') {
          for (uVar14 = 0; uVar14 <= current[3].obu_type; uVar14 = uVar14 + 1) {
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,0x10,"spatial_layer_max_width[i]",(RK_U32 *)&obu_size,0,
                               pAVar16->max_frame_width_minus_1 + 1);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[3].spatial_id)[uVar14] = (byte)obu_size;
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,0x10,"spatial_layer_max_height[i]",(RK_U32 *)&obu_size,0,
                               pAVar16->max_frame_height_minus_1 + 1);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[4].obu_extension_flag)[uVar14] = (byte)obu_size;
          }
        }
        if (current[3].obu_has_size_field != '\0') {
          for (uVar14 = 0; uVar14 <= current[3].obu_type; uVar14 = uVar14 + 1) {
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,8,"spatial_layer_ref_id[i]",(RK_U32 *)&obu_size,0,0xff);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[4].spatial_id)[uVar14] = (byte)obu_size;
          }
        }
        uVar25 = in_stack_fffffffffffffe88._4_4_;
        if (current[3].obu_reserved_1bit != '\0') {
          RVar8 = mpp_av1_read_unsigned(&gbc,8,"temporal_group_size",(RK_U32 *)&obu_size,0,0xff);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[5].obu_extension_flag = (byte)obu_size;
          pRVar17 = &current[0x84].extension_header_reserved_3bits;
          bVar6 = (byte)obu_size;
          for (uVar14 = 0; uVar25 = in_stack_fffffffffffffe88._4_4_, uVar14 < bVar6;
              uVar14 = uVar14 + 1) {
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,3,"temporal_group_temporal_id[i]",(RK_U32 *)&obu_size,0,7);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[5].obu_has_size_field)[uVar14] = (byte)obu_size;
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,1,"temporal_group_temporal_switching_up_point_flag[i]",
                               (RK_U32 *)&obu_size,0,1);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[0x25].obu_extension_flag)[uVar14] = (byte)obu_size;
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,1,"temporal_group_spatial_switching_up_point_flag[i]",
                               (RK_U32 *)&obu_size,0,1);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[0x45].obu_type)[uVar14] = (byte)obu_size;
            RVar8 = mpp_av1_read_unsigned
                              (&gbc,3,"temporal_group_ref_cnt[i]",(RK_U32 *)&obu_size,0,7);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            (&current[0x65].obu_forbidden_bit)[uVar14] = (byte)obu_size;
            bVar6 = (byte)obu_size;
            for (uVar23 = 0; uVar23 < bVar6; uVar23 = uVar23 + 1) {
              RVar8 = mpp_av1_read_unsigned
                                (&gbc,8,"temporal_group_ref_pic_diff[i][j]",(RK_U32 *)&obu_size,0,
                                 0xff);
              if (RVar8 < 0) {
                return MPP_NOK;
              }
              pRVar17[uVar23] = (byte)obu_size;
              bVar6 = (&current[0x65].obu_forbidden_bit)[uVar14];
            }
            bVar6 = current[5].obu_extension_flag;
            pRVar17 = pRVar17 + 7;
          }
        }
      }
      break;
    case (AV1RawOBUHeader)0x4:
      MVar10 = mpp_av1_read_unsigned(&gbc,8,"itu_t_t35_country_code",(RK_U32 *)&obu_size,0,0xff);
      if (MVar10 < MPP_OK) {
        return MVar10;
      }
      current[3].obu_forbidden_bit = (byte)obu_size;
      if ((byte)obu_size == 0xff) {
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,8,"itu_t_t35_country_code_extension_byte",(RK_U32 *)&obu_size,0,0xff
                          );
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].obu_type = (byte)obu_size;
      }
      RVar8 = mpp_get_bits_left(&gbc);
      AVar12 = (AV1RawOBUHeader)(long)(RVar8 / 8 + -1);
      current[6] = AVar12;
      if ((av1d_debug & 8) != 0) {
        _mpp_log_l(4,"av1d_cbs","%s itu_t_t35_country_code %d payload_size %d\n",
                   "mpp_av1_metadata_itut_t35","mpp_av1_metadata_itut_t35",
                   (ulong)current[3].obu_forbidden_bit,AVar12);
        in_stack_fffffffffffffe88 = AVar12;
      }
      RVar8 = mpp_av1_read_unsigned
                        (&gbc,0x10,"itu_t_t35_terminal_provider_code",(RK_U32 *)&obu_size,0,0xffff);
      RVar4 = obu_size;
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[3].obu_reserved_1bit = (byte)obu_size;
      current[3].temporal_id = obu_size._1_1_;
      current[3].spatial_id = obu_size._2_1_;
      current[3].extension_header_reserved_3bits = obu_size._3_1_;
      iVar19 = (RK_U32)obu_size;
      obu_size = RVar4;
      if ((av1d_debug & 8) != 0) {
        _mpp_log_l(4,"av1d_cbs","itu_t_t35_country_code 0x%x\n","mpp_av1_metadata_itut_t35",
                   (ulong)current[3].obu_forbidden_bit);
        iVar19._0_1_ = current[3].obu_reserved_1bit;
        iVar19._1_1_ = current[3].temporal_id;
        iVar19._2_1_ = current[3].spatial_id;
        iVar19._3_1_ = current[3].extension_header_reserved_3bits;
        if ((av1d_debug & 8) != 0) {
          _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_code 0x%x\n",
                     "mpp_av1_metadata_itut_t35");
          iVar19._0_1_ = current[3].obu_reserved_1bit;
          iVar19._1_1_ = current[3].temporal_id;
          iVar19._2_1_ = current[3].spatial_id;
          iVar19._3_1_ = current[3].extension_header_reserved_3bits;
        }
      }
      uVar25 = in_stack_fffffffffffffe88._4_4_;
      if (iVar19 == 0x3c) {
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,0x10,"itu_t_t35_terminal_provider_oriented_code",(RK_U32 *)&obu_size
                           ,0,0xffff);
        RVar4 = obu_size;
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[4].obu_forbidden_bit = (byte)obu_size;
        current[4].obu_type = obu_size._1_1_;
        current[4].obu_extension_flag = obu_size._2_1_;
        current[4].obu_has_size_field = obu_size._3_1_;
        obu_size = RVar4;
        if ((av1d_debug & 8) != 0) {
          _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_oriented_code 0x%x\n",
                     "mpp_av1_metadata_itut_t35");
        }
        gbc.ret = mpp_read_bits(&gbc,8,(RK_S32 *)&obu_size);
        if (((gbc.ret == MPP_OK) &&
            (iVar2._0_1_ = current[4].obu_forbidden_bit, iVar2._1_1_ = current[4].obu_type,
            iVar2._2_1_ = current[4].obu_extension_flag, iVar2._3_1_ = current[4].obu_has_size_field
            , iVar2 == 1)) && (bVar24 = (byte)obu_size == '\x04', bVar24)) {
          uVar11 = mpp_get_bits_left(&gbc);
          uVar20 = (int)uVar11 >> 3;
          pMVar13 = ctx->hdr_dynamic_meta;
          local_80 = (AV1Context *)(ulong)uVar20;
          if (pMVar13 == (MppFrameHdrDynamicMeta *)0x0) {
LAB_001b824a:
            pMVar13 = (MppFrameHdrDynamicMeta *)
                      mpp_osal_calloc("mpp_av1_fill_dynamic_meta",
                                      (size_t)&(local_80->gb).bytes_left_);
            if (pMVar13 == (MppFrameHdrDynamicMeta *)0x0) {
              fname = "mpp_av1_fill_dynamic_meta";
LAB_001b88cf:
              _mpp_log_l(2,"av1d_cbs","malloc hdr dynamic data failed!\n",fname);
              break;
            }
          }
          else if (pMVar13->size < uVar20) {
            mpp_osal_free("mpp_av1_fill_dynamic_meta",pMVar13);
            goto LAB_001b824a;
          }
          if (gbc.data_ != (RK_U8 *)0x0 && 7 < uVar11) {
            memcpy(pMVar13 + 1,gbc.data_,(size_t)local_80);
            pMVar13->size = uVar20;
            pMVar13->hdr_fmt = 8;
            ctx->hdr_dynamic_meta = pMVar13;
            ctx->hdr_dynamic = 1;
            ctx->is_hdr = 1;
          }
        }
      }
      else if (iVar19 == 0x3b) {
        gbc.ret = mpp_read_longbits(&gbc,0x20,(RK_U32 *)&obu_size);
        RVar4 = obu_size;
        uVar25 = in_stack_fffffffffffffe88._4_4_;
        if (gbc.ret == MPP_OK) {
          current[4].obu_forbidden_bit = (byte)obu_size;
          current[4].obu_type = obu_size._1_1_;
          current[4].obu_extension_flag = obu_size._2_1_;
          current[4].obu_has_size_field = obu_size._3_1_;
          iVar18 = (RK_U32)obu_size;
          obu_size = RVar4;
          if ((av1d_debug & 8) != 0) {
            _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_oriented_code 0x%x\n",
                       "mpp_av1_metadata_itut_t35");
            iVar18._0_1_ = current[4].obu_forbidden_bit;
            iVar18._1_1_ = current[4].obu_type;
            iVar18._2_1_ = current[4].obu_extension_flag;
            iVar18._3_1_ = current[4].obu_has_size_field;
          }
          uVar25 = in_stack_fffffffffffffe88._4_4_;
          if (iVar18 == 0x800) {
            pMVar13 = ctx->hdr_dynamic_meta;
            gbc.ret = mpp_skip_longbits(&gbc,3);
            uVar25 = in_stack_fffffffffffffe88._4_4_;
            if (gbc.ret == MPP_OK) {
              gbc.ret = mpp_skip_longbits(&gbc,2);
              uVar25 = in_stack_fffffffffffffe88._4_4_;
              if (gbc.ret == MPP_OK) {
                gbc.ret = mpp_skip_longbits(&gbc,5);
                uVar25 = in_stack_fffffffffffffe88._4_4_;
                if (gbc.ret == MPP_OK) {
                  gbc.ret = mpp_skip_longbits(&gbc,5);
                  uVar25 = in_stack_fffffffffffffe88._4_4_;
                  if (gbc.ret == MPP_OK) {
                    gbc.ret = mpp_skip_longbits(&gbc,1);
                    uVar25 = in_stack_fffffffffffffe88._4_4_;
                    if (gbc.ret == MPP_OK) {
                      gbc.ret = mpp_skip_longbits(&gbc,5);
                      uVar25 = in_stack_fffffffffffffe88._4_4_;
                      if (gbc.ret == MPP_OK) {
                        gbc.ret = mpp_skip_longbits(&gbc,1);
                        uVar25 = in_stack_fffffffffffffe88._4_4_;
                        if (gbc.ret == MPP_OK) {
                          gbc.ret = mpp_skip_longbits(&gbc,5);
                          uVar25 = in_stack_fffffffffffffe88._4_4_;
                          if (gbc.ret == MPP_OK) {
                            iVar19 = 0;
                            while( true ) {
                              gbc.ret = MPP_OK;
                              gbc.ret = mpp_read_bits(&gbc,8,(RK_S32 *)&obu_size);
                              uVar25 = in_stack_fffffffffffffe88._4_4_;
                              if (gbc.ret != MPP_OK) break;
                              iVar18 = (RK_U32)obu_size;
                              gbc.ret = mpp_read_bits(&gbc,1,(RK_S32 *)&obu_size);
                              uVar25 = in_stack_fffffffffffffe88._4_4_;
                              if (gbc.ret != MPP_OK) break;
                              uVar11 = iVar18 + iVar19;
                              if ((RK_U32)obu_size == 0) {
                                if (pMVar13 == (MppFrameHdrDynamicMeta *)0x0) {
                                  pMVar13 = (MppFrameHdrDynamicMeta *)
                                            mpp_osal_calloc("mpp_av1_get_dolby_rpu",0x408);
                                  uVar25 = in_stack_fffffffffffffe88._4_4_;
                                  if (pMVar13 == (MppFrameHdrDynamicMeta *)0x0) {
                                    fname = "mpp_av1_get_dolby_rpu";
                                    goto LAB_001b88cf;
                                  }
                                }
                                mpp_writer_init(&bit_ctx,pMVar13 + 1,0x400);
                                mpp_writer_put_raw_bits(&bit_ctx,0,0x18);
                                mpp_writer_put_raw_bits(&bit_ctx,1,8);
                                mpp_writer_put_raw_bits(&bit_ctx,0x19,8);
                                uVar20 = uVar11;
                                goto LAB_001b8ed4;
                              }
                              iVar19 = uVar11 * 0x100 + 0x100;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    case (AV1RawOBUHeader)0x5:
      MVar10 = mpp_av1_read_unsigned(&gbc,5,"counting_type",(RK_U32 *)&obu_size,0,0x1f);
      if (MVar10 < MPP_OK) {
        return MVar10;
      }
      current[3].obu_forbidden_bit = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"full_timestamp_flag",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[3].obu_type = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"discontinuity_flag",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[3].obu_extension_flag = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,1,"cnt_dropped_flag",(RK_U32 *)&obu_size,0,1);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[3].obu_has_size_field = (byte)obu_size;
      RVar8 = mpp_av1_read_unsigned(&gbc,9,"n_frames",(RK_U32 *)&obu_size,0,0x1ff);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      current[3].obu_reserved_1bit = (byte)obu_size;
      if (current[3].obu_type == '\0') {
        RVar8 = mpp_av1_read_unsigned(&gbc,1,"seconds_flag",(RK_U32 *)&obu_size,0,1);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[4].obu_forbidden_bit = (byte)obu_size;
        if ((byte)obu_size != '\0') {
          RVar8 = mpp_av1_read_unsigned(&gbc,6,"seconds_value",(RK_U32 *)&obu_size,0,0x3b);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[3].temporal_id = (byte)obu_size;
          RVar8 = mpp_av1_read_unsigned(&gbc,1,"minutes_flag",(RK_U32 *)&obu_size,0,1);
          if (RVar8 < 0) {
            return MPP_NOK;
          }
          current[4].obu_type = (byte)obu_size;
          if ((byte)obu_size != '\0') {
            RVar8 = mpp_av1_read_unsigned(&gbc,6,"minutes_value",(RK_U32 *)&obu_size,0,0x3b);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            current[3].spatial_id = (byte)obu_size;
            RVar8 = mpp_av1_read_unsigned(&gbc,1,"hours_flag",(RK_U32 *)&obu_size,0,1);
            if (RVar8 < 0) {
              return MPP_NOK;
            }
            current[4].obu_extension_flag = (byte)obu_size;
            if ((byte)obu_size != '\0') goto LAB_001b75af;
          }
        }
      }
      else {
        RVar8 = mpp_av1_read_unsigned(&gbc,6,"seconds_value",(RK_U32 *)&obu_size,0,0x3b);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].temporal_id = (byte)obu_size;
        RVar8 = mpp_av1_read_unsigned(&gbc,6,"minutes_value",(RK_U32 *)&obu_size,0,0x3b);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].spatial_id = (byte)obu_size;
LAB_001b75af:
        RVar8 = mpp_av1_read_unsigned(&gbc,5,"hours_value",(RK_U32 *)&obu_size,0,0x17);
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[3].extension_header_reserved_3bits = (byte)obu_size;
      }
      RVar8 = mpp_av1_read_unsigned(&gbc,5,"time_offset_length",(RK_U32 *)&obu_size,0,0x1f);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      bVar6 = (byte)obu_size;
      current[4].obu_has_size_field = bVar6;
      if (bVar6 == 0) {
        current[4].obu_has_size_field = '\0';
      }
      else {
        RVar8 = mpp_av1_read_unsigned
                          (&gbc,(RK_U32)obu_size & 0xff,"time_offset_value",(RK_U32 *)&obu_size,0,
                           ~(uint)(-1L << (bVar6 & 0x3f)));
        RVar4 = obu_size;
        if (RVar8 < 0) {
          return MPP_NOK;
        }
        current[4].obu_reserved_1bit = (byte)obu_size;
        current[4].temporal_id = obu_size._1_1_;
        current[4].spatial_id = obu_size._2_1_;
        current[4].extension_header_reserved_3bits = obu_size._3_1_;
        obu_size = RVar4;
      }
      break;
    default:
      _mpp_log_l(2,"av1d_cbs","unknown metadata type %lld\n","mpp_av1_metadata_obu",AVar12);
    }
    break;
  case 6:
    bitctx = &gbc;
    RVar8 = mpp_get_bits_count(bitctx);
    MVar10 = mpp_av1_frame_header_obu(ctx,bitctx,(AV1RawFrameHeader *)(current + 2),0,in_R8);
    if (MVar10 < MPP_OK) {
      return MVar10;
    }
    mpp_av1_byte_alignment((AV1Context *)&gbc,bitctx);
    RVar9 = mpp_av1_tile_group_obu(ctx,&gbc,(AV1RawTileGroup *)(current + 0x85));
    if (RVar9 < 0) {
      return MPP_NOK;
    }
    RVar9 = mpp_get_bits_count(&gbc);
    ctx->frame_tag_size = ctx->frame_tag_size + ((RVar9 - RVar8) + 7U >> 3);
    td = (AV1RawTileData *)(current + 0x86);
    goto LAB_001b7196;
  case 8:
    MVar10 = mpp_av1_read_unsigned
                       (&gbc,8,"output_frame_width_in_tiles_minus_1",(RK_U32 *)&obu_size,0,0xff);
    if (MVar10 < MPP_OK) {
      return MVar10;
    }
    current[2].obu_forbidden_bit = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned
                      (&gbc,8,"output_frame_height_in_tiles_minus_1",(RK_U32 *)&obu_size,0,0xff);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[2].obu_type = (byte)obu_size;
    RVar8 = mpp_av1_read_unsigned(&gbc,0x10,"tile_count_minus_1",(RK_U32 *)&obu_size,0,0xffff);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    current[2].obu_extension_flag = (byte)obu_size;
LAB_001b7182:
    td = (AV1RawTileData *)(current + 3);
LAB_001b7196:
    RVar8 = mpp_av1_ref_tile_data(local_70,&gbc,td);
    if (RVar8 < 0) {
      return MPP_NOK;
    }
    break;
  default:
    goto switchD_001b6c02_caseD_9;
  case 0xf:
    AVar21.obu_forbidden_bit = '\0';
    AVar21.obu_type = '\0';
    AVar21.obu_extension_flag = '\0';
    AVar21.obu_has_size_field = '\0';
    AVar21.obu_reserved_1bit = '\0';
    AVar21.temporal_id = '\0';
    AVar21.spatial_id = '\0';
    AVar21.extension_header_reserved_3bits = '\0';
    AVar12.obu_forbidden_bit = '\0';
    AVar12.obu_type = '\0';
    AVar12.obu_extension_flag = '\0';
    AVar12.obu_has_size_field = '\0';
    AVar12.obu_reserved_1bit = '\0';
    AVar12.temporal_id = '\0';
    AVar12.spatial_id = '\0';
    AVar12.extension_header_reserved_3bits = '\0';
    while (RVar8 = mpp_get_bits_left(&gbc), 7 < RVar8) {
      gbc.ret = mpp_read_bits(&gbc,8,(RK_S32 *)&obu_size);
      if (gbc.ret != MPP_OK) {
        AVar12.obu_forbidden_bit = 0xff;
        AVar12.obu_type = 0xff;
        AVar12.obu_extension_flag = 0xff;
        AVar12.obu_has_size_field = 0xff;
        AVar12.obu_reserved_1bit = 0xff;
        AVar12.temporal_id = 0xff;
        AVar12.spatial_id = 0xff;
        AVar12.extension_header_reserved_3bits = 0xff;
        break;
      }
      if ((byte)obu_size != '\0') {
        AVar12 = AVar21;
      }
      AVar21 = (AV1RawOBUHeader)((long)AVar21 + 1);
    }
    current[3] = AVar12;
    AVar12 = (AV1RawOBUHeader)mpp_osal_malloc("mpp_av1_padding_obu",(size_t)AVar12);
    current[2] = AVar12;
    if (AVar12 == (AV1RawOBUHeader)0x0) {
      return MPP_ERR_NOMEM;
    }
    uVar11 = 0;
    while( true ) {
      uVar25 = in_stack_fffffffffffffe88._4_4_;
      AVar22.obu_reserved_1bit = '\0';
      AVar22.temporal_id = '\0';
      AVar22.spatial_id = '\0';
      AVar22.extension_header_reserved_3bits = '\0';
      AVar22.obu_forbidden_bit = (char)uVar11;
      AVar22.obu_type = (char)(uVar11 >> 8);
      AVar22.obu_extension_flag = (char)(uVar11 >> 0x10);
      AVar22.obu_has_size_field = (char)(uVar11 >> 0x18);
      if ((ulong)current[3] <= (ulong)AVar22) break;
      RVar8 = mpp_av1_read_unsigned(&gbc,8,"obu_padding_byte[i]",(RK_U32 *)&obu_size,0,0xff);
      if (RVar8 < 0) {
        return MPP_NOK;
      }
      *(byte *)((long)current[2] + (long)AVar22) = (byte)obu_size;
      uVar11 = uVar11 + 1;
    }
  }
LAB_001b71b0:
  RVar8 = mpp_get_bits_count(&gbc);
  if (((int)local_70->data_size * 8 < RVar8) &&
     (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "end_pos <= (RK_S32)(unit->data_size * 8)","mpp_av1_read_unit",
                 CONCAT44(uVar25,0xb95)), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_001b8d11:
    abort();
  }
  if ((current[1] != (AV1RawOBUHeader)0x0) &&
     ((8 < current->obu_type || ((0x150U >> (current->obu_type & 0x1f) & 1) == 0)))) {
    iVar19 = SUB84(current[1],0);
    if ((local_74 - RVar8) + iVar19 * 8 < 1) {
      return MPP_NOK;
    }
    uVar11 = ((local_74 + iVar19 * 8) - RVar8) + 1;
    do {
      mpp_skip_bits(&gbc,1);
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
  MVar10 = MPP_OK;
switchD_001b6c02_caseD_9:
  return MVar10;
LAB_001b8ed4:
  uVar25 = in_stack_fffffffffffffe88._4_4_;
  bVar24 = uVar20 == 0;
  uVar20 = uVar20 - 1;
  if (bVar24) goto LAB_001b8f0f;
  gbc.ret = mpp_read_bits(&gbc,8,(RK_S32 *)&obu_size);
  uVar25 = in_stack_fffffffffffffe88._4_4_;
  if (gbc.ret != MPP_OK) goto LAB_001b71b0;
  mpp_writer_put_bits(&bit_ctx,(uint)(byte)obu_size,8);
  goto LAB_001b8ed4;
LAB_001b8f0f:
  uVar20 = mpp_writer_bytes(&bit_ctx);
  pMVar13->size = uVar20;
  pMVar13->hdr_fmt = 0xb;
  if ((av1d_debug & 8) != 0) {
    _mpp_log_l(4,"av1d_cbs","dolby rpu size %d -> %d\n","mpp_av1_get_dolby_rpu",(ulong)uVar11,
               (ulong)uVar20);
  }
  RVar3 = av1d_debug;
  ctx->hdr_dynamic_meta = pMVar13;
  ctx->hdr_dynamic = 1;
  ctx->is_hdr = 1;
  if ((RVar3 >> 0x1c & 1) != 0) {
    mpp_av1_get_dolby_rpu_g_frame_no = mpp_av1_get_dolby_rpu_g_frame_no + 1;
    sprintf((char *)&obu_size,"/data/video/meta_%d.txt");
    __s = fopen((char *)&obu_size,"wb");
    _mpp_log_l(2,"av1d_cbs","open %s %p\n",(char *)0x0,&obu_size,__s);
    if (__s != (FILE *)0x0) {
      fwrite(pMVar13 + 1,1,(ulong)pMVar13->size,__s);
    }
    fflush(__s);
    fclose(__s);
  }
  goto LAB_001b71b0;
}

Assistant:

MPP_RET mpp_av1_read_unit(AV1Context *ctx, Av1ObuUnit *unit)
{
    AV1RawOBU *obu;
    BitReadCtx_t gbc;
    RK_S32 err = 0, start_pos, end_pos, hdr_start_pos;

    err = mpp_av1_alloc_unit_content(unit);

    if (err < 0)
        return err;

    obu = unit->content;

    mpp_set_bitread_ctx(&gbc, unit->data, unit->data_size);

    hdr_start_pos = mpp_get_bits_count(&gbc);

    err = mpp_av1_read_obu_header(ctx, &gbc, &obu->header);
    if (err < 0)
        return err;
    mpp_assert(obu->header.obu_type == unit->type);

    if (obu->header.obu_has_size_field) {
        RK_U64 obu_size = 0;
        err = mpp_av1_read_leb128(&gbc, &obu_size);
        if (err < 0)
            return err;
        obu->obu_size = obu_size;
    } else {
        if (unit->data_size < (RK_U32)(1 + obu->header.obu_extension_flag)) {
            mpp_err( "Invalid OBU length: "
                     "unit too short (%d).\n", unit->data_size);
            return MPP_NOK;
        }
        obu->obu_size = unit->data_size - 1 - obu->header.obu_extension_flag;
    }

    start_pos = mpp_get_bits_count(&gbc);
    if (!ctx->fist_tile_group)
        ctx->frame_tag_size += ((start_pos - hdr_start_pos + 7) >> 3);
    if (obu->header.obu_extension_flag) {
        if (obu->header.obu_type != AV1_OBU_SEQUENCE_HEADER &&
            obu->header.obu_type != AV1_OBU_TEMPORAL_DELIMITER &&
            ctx->operating_point_idc) {
            RK_S32 in_temporal_layer =
                (ctx->operating_point_idc >>  ctx->temporal_id    ) & 1;
            RK_S32 in_spatial_layer  =
                (ctx->operating_point_idc >> (ctx->spatial_id + 8)) & 1;
            if (!in_temporal_layer || !in_spatial_layer) {
                return MPP_ERR_PROTOL; // drop_obu()
            }
        }
    }
    av1d_dbg(AV1D_DBG_HEADER, "obu type %d size %d\n",
             obu->header.obu_type, obu->obu_size);
    switch (obu->header.obu_type) {
    case AV1_OBU_SEQUENCE_HEADER: {
        err = mpp_av1_sequence_header_obu(ctx, &gbc,
                                          &obu->obu.sequence_header);
        if (err < 0)
            return err;
        ctx->frame_tag_size += obu->obu_size;
        if (ctx->operating_point >= 0) {
            AV1RawSequenceHeader *sequence_header = &obu->obu.sequence_header;

            if (ctx->operating_point > sequence_header->operating_points_cnt_minus_1) {
                mpp_err("Invalid Operating Point %d requested. "
                        "Must not be higher than %u.\n",
                        ctx->operating_point, sequence_header->operating_points_cnt_minus_1);
                return MPP_ERR_PROTOL;
            }
            ctx->operating_point_idc = sequence_header->operating_point_idc[ctx->operating_point];
        }

        ctx->sequence_header = NULL;
        ctx->sequence_header = &obu->obu.sequence_header;
    } break;
    case AV1_OBU_TEMPORAL_DELIMITER: {
        err = mpp_av1_temporal_delimiter_obu(ctx, &gbc);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_FRAME_HEADER:
    case AV1_OBU_REDUNDANT_FRAME_HEADER: {
        err = mpp_av1_frame_header_obu(ctx, &gbc,
                                       &obu->obu.frame_header,
                                       obu->header.obu_type ==
                                       AV1_OBU_REDUNDANT_FRAME_HEADER,
                                       NULL);
        if (err < 0)
            return err;
        ctx->frame_tag_size += obu->obu_size;
    } break;
    case AV1_OBU_TILE_GROUP: {
        RK_U32 cur_pos = mpp_get_bits_count(&gbc);

        err = mpp_av1_tile_group_obu(ctx, &gbc, &obu->obu.tile_group);
        if (err < 0)
            return err;
        if (!ctx->fist_tile_group)
            ctx->frame_tag_size += MPP_ALIGN(mpp_get_bits_count(&gbc) - cur_pos, 8) / 8;
        ctx->fist_tile_group = 1;
        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.tile_group.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_FRAME: {
        err = mpp_av1_frame_obu(ctx, &gbc, &obu->obu.frame,
                                NULL);
        if (err < 0)
            return err;

        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.frame.tile_group.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_TILE_LIST: {
        err = mpp_av1_tile_list_obu(ctx, &gbc, &obu->obu.tile_list);
        if (err < 0)
            return err;

        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.tile_list.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_METADATA: {
        ctx->frame_tag_size += obu->obu_size;
        err = mpp_av1_metadata_obu(ctx, &gbc, &obu->obu.metadata);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_PADDING: {
        err = mpp_av1_padding_obu(ctx, &gbc, &obu->obu.padding);
        if (err < 0)
            return err;
    } break;
    default:
        return MPP_ERR_VALUE;
    }

    end_pos = mpp_get_bits_count(&gbc);
    mpp_assert(end_pos <= (RK_S32)(unit->data_size * 8));

    if (obu->obu_size > 0 &&
        obu->header.obu_type != AV1_OBU_TILE_GROUP &&
        obu->header.obu_type != AV1_OBU_TILE_LIST &&
        obu->header.obu_type != AV1_OBU_FRAME) {
        RK_S32 nb_bits = obu->obu_size * 8 + start_pos - end_pos;

        if (nb_bits <= 0)
            return MPP_NOK;

        err = mpp_av1_trailing_bits(ctx, &gbc, nb_bits);
        if (err < 0)
            return err;
    }

    return 0;
}